

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumhashgenerator.cpp
# Opt level: O2

char * __thiscall SumHashGenerator::hash(SumHashGenerator *this,char *src)

{
  size_t sVar1;
  ulong uVar2;
  char *__s;
  ulong uVar3;
  ulong unaff_RBX;
  
  sVar1 = strlen(src);
  uVar3 = 0;
  uVar2 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    unaff_RBX = (ulong)(uint)((int)unaff_RBX + (int)src[uVar3]);
  }
  uVar3 = unaff_RBX >> 0x1f & 1;
  uVar2 = unaff_RBX;
  while( true ) {
    uVar3 = uVar3 + 1;
    if ((int)uVar2 == 0) break;
    uVar2 = (long)(int)uVar2 / 10;
  }
  __s = (char *)operator_new__(uVar3);
  memset(__s,0,uVar3);
  sprintf(__s,"%d",unaff_RBX & 0xffffffff);
  return __s;
}

Assistant:

char* SumHashGenerator::hash(const char* src)
{
	int len = strlen(src);
	int sumlen = 0;
	int sum;

	for (int i = 0; i < len; ++i) {
		sum += (int)src[i];
	}

	sumlen = getNumberLength(sum);
	char* res = new char[sumlen + 1];
	memset(res, 0x00, sumlen + 1);

	sprintf(res, "%d", sum);

	return res;
}